

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-impl.h
# Opt level: O2

ggml_fp16_t ggml_compute_fp32_to_fp16(float f)

{
  ushort uVar1;
  anon_union_4_2_5fd15f10 fp32_1;
  float base;
  anon_union_4_2_5fd15f10 fp32_2;
  float fVar2;
  
  fVar2 = 2.0;
  if (0x70ffffff < (uint)((int)f * 2)) {
    fVar2 = (float)(((uint)f & 0x7f800000) + 0x7800000);
  }
  fVar2 = fVar2 + (float)((uint)f & (uint)DAT_0014b020) * 5.192297e+33 * 7.70372e-34;
  uVar1 = 0x7e00;
  if ((uint)((int)f * 2) < 0xff000001) {
    uVar1 = (SUB42(fVar2,0) & 0xfff) + ((ushort)((uint)fVar2 >> 0xd) & 0x7c00);
  }
  return uVar1 | (ushort)((uint)f >> 0x10) & 0x8000;
}

Assistant:

static inline ggml_fp16_t ggml_compute_fp32_to_fp16(float f) {
    #if (defined(__STDC_VERSION__) && (__STDC_VERSION__ >= 199901L) || defined(__GNUC__) && !defined(__STRICT_ANSI__)) && (!defined(__cplusplus) || __cplusplus >= 201703L)
        const float scale_to_inf = 0x1.0p+112f;
        const float scale_to_zero = 0x1.0p-110f;
    #else
        const float scale_to_inf = fp32_from_bits(UINT32_C(0x77800000));
        const float scale_to_zero = fp32_from_bits(UINT32_C(0x08800000));
    #endif
        float base = (fabsf(f) * scale_to_inf) * scale_to_zero;

        const uint32_t w = fp32_to_bits(f);
        const uint32_t shl1_w = w + w;
        const uint32_t sign = w & UINT32_C(0x80000000);
        uint32_t bias = shl1_w & UINT32_C(0xFF000000);
        if (bias < UINT32_C(0x71000000)) {
            bias = UINT32_C(0x71000000);
        }

        base = fp32_from_bits((bias >> 1) + UINT32_C(0x07800000)) + base;
        const uint32_t bits = fp32_to_bits(base);
        const uint32_t exp_bits = (bits >> 13) & UINT32_C(0x00007C00);
        const uint32_t mantissa_bits = bits & UINT32_C(0x00000FFF);
        const uint32_t nonsign = exp_bits + mantissa_bits;
        return (sign >> 16) | (shl1_w > UINT32_C(0xFF000000) ? UINT16_C(0x7E00) : nonsign);
    }